

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

bool ClipperLib::SlopesNearCollinear(IntPoint *pt1,IntPoint *pt2,IntPoint *pt3,double distSqrd)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  lVar1 = pt1->X;
  lVar2 = pt1->Y;
  lVar3 = pt2->X;
  uVar6 = lVar1 - lVar3;
  uVar8 = -uVar6;
  if (0 < (long)uVar6) {
    uVar8 = uVar6;
  }
  lVar4 = pt2->Y;
  uVar7 = lVar2 - lVar4;
  uVar6 = -uVar7;
  if (0 < (long)uVar7) {
    uVar6 = uVar7;
  }
  if (uVar6 < uVar8) {
    lVar9 = pt3->X;
    if (lVar3 < lVar1 != (lVar9 - lVar1 == 0 || lVar9 < lVar1)) {
      lVar5 = pt3->Y;
      lVar9 = lVar9 - lVar3;
      goto LAB_00297452;
    }
    if ((lVar3 - lVar1 != 0 && lVar1 <= lVar3) == lVar9 <= lVar3) {
      dVar12 = (double)(long)uVar7;
      dVar11 = (double)(lVar3 - lVar1);
      dVar13 = (double)lVar9;
      dVar10 = (double)lVar1 * dVar12 + (double)lVar2 * dVar11;
      dVar14 = (double)pt3->Y;
      goto LAB_00297588;
    }
    dVar10 = (double)(lVar2 - pt3->Y);
    dVar12 = (double)(lVar9 - lVar1);
    dVar13 = (double)lVar1 * dVar10 + (double)lVar2 * dVar12;
  }
  else {
    lVar5 = pt3->Y;
    if (lVar4 < lVar2 == lVar5 <= lVar2) {
      if (lVar2 < lVar4 == lVar5 <= lVar4) {
        dVar12 = (double)(long)uVar7;
        dVar11 = (double)(lVar3 - lVar1);
        dVar13 = (double)pt3->X;
        dVar10 = (double)lVar1 * dVar12 + (double)lVar2 * dVar11;
        dVar14 = (double)lVar5;
      }
      else {
        dVar12 = (double)(lVar2 - lVar5);
        dVar11 = (double)(pt3->X - lVar1);
        dVar13 = (double)lVar3;
        dVar10 = (double)lVar1 * dVar12 + (double)lVar2 * dVar11;
        dVar14 = (double)lVar4;
      }
LAB_00297588:
      dVar10 = (dVar13 * dVar12 + dVar14 * dVar11) - dVar10;
      dVar13 = (dVar10 * dVar10) / (dVar12 * dVar12 + dVar11 * dVar11);
      goto LAB_002975ac;
    }
    lVar9 = pt3->X - lVar3;
LAB_00297452:
    dVar12 = (double)lVar9;
    dVar10 = (double)(lVar4 - lVar5);
    dVar13 = (double)lVar3 * dVar10 + (double)lVar4 * dVar12;
    lVar3 = lVar1;
    lVar4 = lVar2;
  }
  dVar13 = ((double)lVar3 * dVar10 + (double)lVar4 * dVar12) - dVar13;
  dVar13 = (dVar13 * dVar13) / (dVar10 * dVar10 + dVar12 * dVar12);
LAB_002975ac:
  return dVar13 < distSqrd;
}

Assistant:

bool SlopesNearCollinear(const IntPoint& pt1, 
    const IntPoint& pt2, const IntPoint& pt3, double distSqrd)
{
  //this function is more accurate when the point that's geometrically
  //between the other 2 points is the one that's tested for distance.
  //ie makes it more likely to pick up 'spikes' ...
	if (Abs(pt1.X - pt2.X) > Abs(pt1.Y - pt2.Y))
	{
    if ((pt1.X > pt2.X) == (pt1.X < pt3.X))
      return DistanceFromLineSqrd(pt1, pt2, pt3) < distSqrd;
    else if ((pt2.X > pt1.X) == (pt2.X < pt3.X))
      return DistanceFromLineSqrd(pt2, pt1, pt3) < distSqrd;
		else
	    return DistanceFromLineSqrd(pt3, pt1, pt2) < distSqrd;
	}
	else
	{
    if ((pt1.Y > pt2.Y) == (pt1.Y < pt3.Y))
      return DistanceFromLineSqrd(pt1, pt2, pt3) < distSqrd;
    else if ((pt2.Y > pt1.Y) == (pt2.Y < pt3.Y))
      return DistanceFromLineSqrd(pt2, pt1, pt3) < distSqrd;
		else
      return DistanceFromLineSqrd(pt3, pt1, pt2) < distSqrd;
	}
}